

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicsview.cpp
# Opt level: O2

void QGraphicsView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  qreal *pqVar1;
  qreal qVar2;
  undefined4 uVar3;
  undefined8 *puVar4;
  InterfaceType *pIVar5;
  QFlagsStorage<QGraphicsScene::SceneLayer> layers;
  QRectF *pQVar6;
  long in_FS_OFFSET;
  QRectF local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        rubberBandChanged((QGraphicsView *)_o,*(QRect *)_a[1],*(QPointF *)_a[2],*(QPointF *)_a[3]);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        updateScene((QGraphicsView *)_o,(QList<QRectF> *)_a[1]);
        return;
      }
      break;
    case 2:
      pQVar6 = (QRectF *)_a[1];
      layers.i = *_a[2];
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
LAB_005c1e48:
        invalidateScene((QGraphicsView *)_o,pQVar6,(SceneLayers)layers.i);
        return;
      }
      break;
    case 3:
      pQVar6 = (QRectF *)_a[1];
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        layers.i = 0xffff;
        goto LAB_005c1e48;
      }
      break;
    case 4:
      local_38.w = 0.0;
      local_38.h = 0.0;
      local_38.xp = 0.0;
      local_38.yp = 0.0;
      invalidateScene((QGraphicsView *)_o,&local_38,(SceneLayers)0xffff);
      goto switchD_005c1c97_caseD_3;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        updateSceneRect((QGraphicsView *)_o,(QRectF *)_a[1]);
        return;
      }
      break;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        (**(code **)(*(long *)_o + 0x1a8))
                  (_o,*_a[1],*(long *)(in_FS_OFFSET + 0x28),*(code **)(*(long *)_o + 0x1a8));
        return;
      }
      break;
    case 7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QGraphicsViewPrivate::_q_setViewportCursor
                  (*(QGraphicsViewPrivate **)(_o + 8),(QCursor *)_a[1]);
        return;
      }
      break;
    case 8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QGraphicsViewPrivate::_q_unsetViewportCursor(*(QGraphicsViewPrivate **)(_o + 8));
        return;
      }
      break;
    default:
      goto switchD_005c1c97_caseD_3;
    }
    goto LAB_005c217c;
  case ReadProperty:
    if (0xc < (uint)_id) goto switchD_005c1c97_caseD_3;
    pqVar1 = (qreal *)*_a;
    switch(_id) {
    case 0:
      backgroundBrush((QGraphicsView *)&local_38);
      goto LAB_005c211d;
    case 1:
      foregroundBrush((QGraphicsView *)&local_38);
LAB_005c211d:
      qVar2 = *pqVar1;
      *pqVar1 = local_38.xp;
      local_38.xp = qVar2;
      QBrush::~QBrush((QBrush *)&local_38);
      goto switchD_005c1c97_caseD_3;
    case 2:
      *(byte *)pqVar1 = *(byte *)(*(long *)(_o + 8) + 0x300) & 1;
      goto switchD_005c1c97_caseD_3;
    case 3:
      sceneRect(&local_38,(QGraphicsView *)_o);
      pqVar1[2] = local_38.w;
      pqVar1[3] = local_38.h;
      *pqVar1 = local_38.xp;
      pqVar1[1] = local_38.yp;
      goto switchD_005c1c97_caseD_3;
    case 4:
      uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x478);
      break;
    case 5:
      uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x2f8);
      break;
    case 6:
      uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x2fc);
      break;
    case 7:
      uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x4c0);
      break;
    case 8:
      uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x47c);
      break;
    case 9:
      uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x480);
      break;
    case 10:
      uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x484);
      break;
    case 0xb:
      uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x4b4);
      break;
    case 0xc:
      uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x488);
    }
    *(undefined4 *)pqVar1 = uVar3;
    goto switchD_005c1c97_caseD_3;
  case WriteProperty:
    if (0xc < (uint)_id) goto switchD_005c1c97_caseD_3;
    break;
  default:
    goto switchD_005c1c97_caseD_3;
  case IndexOfMethod:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QtMocHelpers::indexOfMethod<void(QGraphicsView::*)(QRect,QPointF,QPointF)>
                ((QtMocHelpers *)_a,(void **)rubberBandChanged,0,0);
      return;
    }
    goto LAB_005c217c;
  case RegisterMethodArgumentMetaType:
    if (_id == 1) {
      puVar4 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QRectF>_>::metaType;
LAB_005c1dd2:
        *puVar4 = pIVar5;
        goto switchD_005c1c97_caseD_3;
      }
    }
    else if (_id == 6) {
      puVar4 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
        goto LAB_005c1dd2;
      }
    }
    else {
      puVar4 = (undefined8 *)*_a;
    }
    *puVar4 = 0;
    goto switchD_005c1c97_caseD_3;
  }
  pQVar6 = (QRectF *)*_a;
  switch(_id) {
  case 0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      setBackgroundBrush((QGraphicsView *)_o,(QBrush *)pQVar6);
      return;
    }
    break;
  case 1:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      setForegroundBrush((QGraphicsView *)_o,(QBrush *)pQVar6);
      return;
    }
    break;
  case 2:
    *(uint *)(*(long *)(_o + 8) + 0x300) =
         *(uint *)(*(long *)(_o + 8) + 0x300) & 0xfffffffe | (uint)*(byte *)&pQVar6->xp;
    goto switchD_005c1c97_caseD_3;
  case 3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      setSceneRect((QGraphicsView *)_o,pQVar6);
      return;
    }
    break;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      setAlignment((QGraphicsView *)_o,
                   (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                   *(QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)&pQVar6->xp);
      return;
    }
    break;
  case 5:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      setRenderHints((QGraphicsView *)_o,
                     (QFlagsStorageHelper<QPainter::RenderHint,_4>)
                     *(QFlagsStorageHelper<QPainter::RenderHint,_4> *)&pQVar6->xp);
      return;
    }
    break;
  case 6:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      setDragMode((QGraphicsView *)_o,*(DragMode *)&pQVar6->xp);
      return;
    }
    break;
  case 7:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      setCacheMode((QGraphicsView *)_o,
                   (QFlagsStorageHelper<QGraphicsView::CacheModeFlag,_4>)
                   *(QFlagsStorageHelper<QGraphicsView::CacheModeFlag,_4> *)&pQVar6->xp);
      return;
    }
    break;
  case 8:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      setTransformationAnchor((QGraphicsView *)_o,*(ViewportAnchor *)&pQVar6->xp);
      return;
    }
    break;
  case 9:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      setResizeAnchor((QGraphicsView *)_o,*(ViewportAnchor *)&pQVar6->xp);
      return;
    }
    break;
  case 10:
    *(undefined4 *)(*(long *)(_o + 8) + 0x484) = *(undefined4 *)&pQVar6->xp;
    goto switchD_005c1c97_caseD_3;
  case 0xb:
    *(undefined4 *)(*(long *)(_o + 8) + 0x4b4) = *(undefined4 *)&pQVar6->xp;
    goto switchD_005c1c97_caseD_3;
  case 0xc:
    *(undefined4 *)(*(long *)(_o + 8) + 0x488) = *(undefined4 *)&pQVar6->xp;
switchD_005c1c97_caseD_3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
LAB_005c217c:
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsView *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->rubberBandChanged((*reinterpret_cast< std::add_pointer_t<QRect>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QPointF>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QPointF>>(_a[3]))); break;
        case 1: _t->updateScene((*reinterpret_cast< std::add_pointer_t<QList<QRectF>>>(_a[1]))); break;
        case 2: _t->invalidateScene((*reinterpret_cast< std::add_pointer_t<QRectF>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QGraphicsScene::SceneLayers>>(_a[2]))); break;
        case 3: _t->invalidateScene((*reinterpret_cast< std::add_pointer_t<QRectF>>(_a[1]))); break;
        case 4: _t->invalidateScene(); break;
        case 5: _t->updateSceneRect((*reinterpret_cast< std::add_pointer_t<QRectF>>(_a[1]))); break;
        case 6: _t->setupViewport((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 7: _t->d_func()->_q_setViewportCursor((*reinterpret_cast< std::add_pointer_t<QCursor>>(_a[1]))); break;
        case 8: _t->d_func()->_q_unsetViewportCursor(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QRectF> >(); break;
            }
            break;
        case 6:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsView::*)(QRect , QPointF , QPointF )>(_a, &QGraphicsView::rubberBandChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QBrush*>(_v) = _t->backgroundBrush(); break;
        case 1: *reinterpret_cast<QBrush*>(_v) = _t->foregroundBrush(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isInteractive(); break;
        case 3: *reinterpret_cast<QRectF*>(_v) = _t->sceneRect(); break;
        case 4: *reinterpret_cast<Qt::Alignment*>(_v) = _t->alignment(); break;
        case 5: QtMocHelpers::assignFlags<QPainter::RenderHints>(_v, _t->renderHints()); break;
        case 6: *reinterpret_cast<DragMode*>(_v) = _t->dragMode(); break;
        case 7: QtMocHelpers::assignFlags<CacheMode>(_v, _t->cacheMode()); break;
        case 8: *reinterpret_cast<ViewportAnchor*>(_v) = _t->transformationAnchor(); break;
        case 9: *reinterpret_cast<ViewportAnchor*>(_v) = _t->resizeAnchor(); break;
        case 10: *reinterpret_cast<ViewportUpdateMode*>(_v) = _t->viewportUpdateMode(); break;
        case 11: *reinterpret_cast<Qt::ItemSelectionMode*>(_v) = _t->rubberBandSelectionMode(); break;
        case 12: QtMocHelpers::assignFlags<OptimizationFlags>(_v, _t->optimizationFlags()); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setBackgroundBrush(*reinterpret_cast<QBrush*>(_v)); break;
        case 1: _t->setForegroundBrush(*reinterpret_cast<QBrush*>(_v)); break;
        case 2: _t->setInteractive(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setSceneRect(*reinterpret_cast<QRectF*>(_v)); break;
        case 4: _t->setAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 5: _t->setRenderHints(*reinterpret_cast<QPainter::RenderHints*>(_v)); break;
        case 6: _t->setDragMode(*reinterpret_cast<DragMode*>(_v)); break;
        case 7: _t->setCacheMode(*reinterpret_cast<CacheMode*>(_v)); break;
        case 8: _t->setTransformationAnchor(*reinterpret_cast<ViewportAnchor*>(_v)); break;
        case 9: _t->setResizeAnchor(*reinterpret_cast<ViewportAnchor*>(_v)); break;
        case 10: _t->setViewportUpdateMode(*reinterpret_cast<ViewportUpdateMode*>(_v)); break;
        case 11: _t->setRubberBandSelectionMode(*reinterpret_cast<Qt::ItemSelectionMode*>(_v)); break;
        case 12: _t->setOptimizationFlags(*reinterpret_cast<OptimizationFlags*>(_v)); break;
        default: break;
        }
    }
}